

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O2

Seg_Man_t * Seg_ManAlloc(Gia_Man_t *pGia,int nFanouts)

{
  uint n;
  int iVar1;
  uint uVar2;
  Seg_Man_t *p;
  Vec_Int_t *pVVar3;
  Vec_Int_t *vToSkip;
  sat_solver *s;
  uint uVar4;
  
  p = (Seg_Man_t *)calloc(1,0x78);
  pVVar3 = Vec_IntAlloc(1000);
  p->vPolars = pVVar3;
  vToSkip = Vec_IntAlloc(1000);
  p->vToSkip = vToSkip;
  pVVar3 = Seg_ManCountIntEdges(pGia,pVVar3,vToSkip,nFanouts);
  p->vEdges = pVVar3;
  n = pVVar3->nSize / 2;
  p->nVars = n;
  uVar4 = n;
  if (1 < n) {
    uVar4 = 0;
    for (uVar2 = n - 1; uVar2 != 0; uVar2 = uVar2 >> 1) {
      uVar4 = uVar4 + 1;
    }
  }
  p->LogN = uVar4;
  p->Power2 = 1 << ((byte)uVar4 & 0x1f);
  s = sat_solver_new();
  p->pSat = s;
  sat_solver_setnvars(s,n);
  iVar1 = sat_solver_nvars(s);
  p->FirstVar = iVar1;
  sat_solver_bookmark(s);
  p->pGia = pGia;
  pVVar3 = Vec_IntAlloc(0);
  p->vFirsts = pVVar3;
  pVVar3 = Vec_IntAlloc(0);
  p->vNvars = pVVar3;
  pVVar3 = Vec_IntAlloc(0);
  p->vLits = pVVar3;
  iVar1 = Seg_ManCountIntLevels(p,iVar1);
  sat_solver_setnvars(p->pSat,iVar1);
  Gia_ManFillValue(pGia);
  return p;
}

Assistant:

Seg_Man_t * Seg_ManAlloc( Gia_Man_t * pGia, int nFanouts )
{
    int nVarsAll;
    Seg_Man_t * p = ABC_CALLOC( Seg_Man_t, 1 );
    p->vPolars    = Vec_IntAlloc( 1000 ); 
    p->vToSkip    = Vec_IntAlloc( 1000 ); 
    p->vEdges     = Seg_ManCountIntEdges( pGia, p->vPolars, p->vToSkip, nFanouts );
    p->nVars      = Vec_IntSize(p->vEdges)/2;
    p->LogN       = Abc_Base2Log(p->nVars);
    p->Power2     = 1 << p->LogN;
    //p->pSat       = Sbm_AddCardinSolver( p->LogN, &p->vCardVars );
    p->pSat       = sat_solver_new();
    sat_solver_setnvars( p->pSat, p->nVars );
    p->FirstVar   = sat_solver_nvars( p->pSat );
    sat_solver_bookmark( p->pSat );
    p->pGia       = pGia;
    // internal
    p->vFirsts    = Vec_IntAlloc( 0 ); 
    p->vNvars     = Vec_IntAlloc( 0 ); 
    p->vLits      = Vec_IntAlloc( 0 ); 
    nVarsAll      = Seg_ManCountIntLevels( p, p->FirstVar );
    sat_solver_setnvars( p->pSat, nVarsAll );
    // other
    Gia_ManFillValue( pGia );
    return p;
}